

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covariance_matrix_generator.cc
# Opt level: O3

void webrtc::CovarianceMatrixGenerator::PhaseAlignmentMasks
               (size_t frequency_bin,size_t fft_size,int sample_rate,float sound_speed,
               vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
               *geometry,float angle,ComplexMatrix<float> *mat)

{
  pointer ppcVar1;
  double dVar2;
  string *result;
  pointer pCVar3;
  pointer pCVar4;
  int line;
  ulong uVar5;
  long lVar6;
  float fVar7;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  size_t local_1e0;
  undefined1 local_1d8 [16];
  double local_1c0;
  double local_1b8;
  double local_1b0;
  FatalMessage local_1a8;
  
  local_1d8._0_4_ = sound_speed;
  local_1e0 = CONCAT44(local_1e0._4_4_,1);
  local_1a8._0_8_ = (mat->super_Matrix<std::complex<float>_>).num_rows_;
  if ((local_1a8._0_8_ != 1) &&
     (result = rtc::MakeCheckOpString<unsigned_int,unsigned_long>
                         ((uint *)&local_1e0,(unsigned_long *)&local_1a8,"1u == mat->num_rows()"),
     result != (string *)0x0)) {
    line = 0x61;
LAB_00174392:
    rtc::FatalMessage::FatalMessage
              (&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/beamformer/covariance_matrix_generator.cc"
               ,line,result);
    rtc::FatalMessage::~FatalMessage(&local_1a8);
  }
  pCVar3 = (geometry->
           super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pCVar4 = (geometry->
           super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_1a8._0_8_ = ((long)pCVar4 - (long)pCVar3 >> 2) * -0x5555555555555555;
  local_1e0 = (mat->super_Matrix<std::complex<float>_>).num_columns_;
  if (local_1a8._0_8_ - local_1e0 != 0) {
    result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                       ((unsigned_long *)&local_1a8,&local_1e0,
                        "geometry.size() == mat->num_columns()");
    if (result != (string *)0x0) {
      line = 0x62;
      goto LAB_00174392;
    }
    pCVar3 = (geometry->
             super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pCVar4 = (geometry->
             super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  }
  if (pCVar4 != pCVar3) {
    ppcVar1 = (mat->super_Matrix<std::complex<float>_>).elements_.
              super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_1b8 = (double)((float)sample_rate * ((float)frequency_bin / (float)fft_size));
    local_1c0 = (double)(float)local_1d8._0_4_;
    lVar6 = 0;
    uVar5 = 0;
    do {
      fVar7 = cosf(angle);
      local_1d8._0_4_ =
           fVar7 * *(float *)((long)((geometry->
                                     super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->c + lVar6);
      fVar7 = sinf(angle);
      local_1b0 = (double)(float)(((double)(fVar7 * *(float *)((long)((geometry->
                                                                                                                                            
                                                  super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->c +
                                                  lVar6 + 4) + (float)local_1d8._0_4_) *
                                   -6.283185307179586 * local_1b8) / local_1c0);
      dVar2 = cos(local_1b0);
      local_1d8._8_4_ = extraout_XMM0_Dc;
      local_1d8._0_8_ = dVar2;
      local_1d8._12_4_ = extraout_XMM0_Dd;
      dVar2 = sin(local_1b0);
      (*ppcVar1)[uVar5]._M_value = CONCAT44((float)dVar2,(float)(double)local_1d8._0_8_);
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0xc;
    } while (uVar5 < (ulong)(((long)(geometry->
                                    super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(geometry->
                                    super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 2) *
                            -0x5555555555555555));
  }
  return;
}

Assistant:

void CovarianceMatrixGenerator::PhaseAlignmentMasks(
    size_t frequency_bin,
    size_t fft_size,
    int sample_rate,
    float sound_speed,
    const std::vector<Point>& geometry,
    float angle,
    ComplexMatrix<float>* mat) {
  RTC_CHECK_EQ(1u, mat->num_rows());
  RTC_CHECK_EQ(geometry.size(), mat->num_columns());

  float freq_in_hertz =
      (static_cast<float>(frequency_bin) / fft_size) * sample_rate;

  complex<float>* const* mat_els = mat->elements();
  for (size_t c_ix = 0; c_ix < geometry.size(); ++c_ix) {
    float distance = std::cos(angle) * geometry[c_ix].x() +
                     std::sin(angle) * geometry[c_ix].y();
    float phase_shift = -2.f * M_PI * distance * freq_in_hertz / sound_speed;

    // Euler's formula for mat[0][c_ix] = e^(j * phase_shift).
    mat_els[0][c_ix] = complex<float>(cos(phase_shift), sin(phase_shift));
  }
}